

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::ProcessBlockEntry(metadata_map_t *m,BlockEntry *block_entry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppVar3;
  FILE *f;
  MetadataInfo *info;
  BG *block_group;
  _Base_ptr local_40;
  _Self local_38;
  iter_t i;
  longlong tn;
  Block *block;
  BlockEntry *block_entry_local;
  metadata_map_t *m_local;
  
  iVar2 = (*block_entry->_vptr_BlockEntry[2])();
  local_40 = (_Base_ptr)mkvparser::Block::GetTrackNumber((Block *)CONCAT44(extraout_var,iVar2));
  i._M_node = local_40;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
       ::find(m,(key_type *)&local_40);
  block_group = (BG *)std::
                      map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
                      ::end(m);
  bVar1 = std::operator==(&local_38,(_Self *)&block_group);
  if (bVar1) {
    m_local._7_1_ = true;
  }
  else {
    iVar2 = (*block_entry->_vptr_BlockEntry[3])();
    if (iVar2 == 2) {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
               ::operator->(&local_38);
      m_local._7_1_ = WriteCue((ppVar3->second).file,(BlockGroup *)block_entry);
    }
    else {
      m_local._7_1_ = false;
    }
  }
  return m_local._7_1_;
}

Assistant:

bool vttdemux::ProcessBlockEntry(const metadata_map_t& m,
                                 const mkvparser::BlockEntry* block_entry) {
  // If the track number for this block is in the cache, then we have
  // a metadata block, so write the WebVTT cue to the output file.

  const mkvparser::Block* const block = block_entry->GetBlock();
  const long long tn = block->GetTrackNumber();  // NOLINT

  typedef metadata_map_t::const_iterator iter_t;
  const iter_t i = m.find(static_cast<metadata_map_t::key_type>(tn));

  if (i == m.end())  // not a metadata track
    return true;  // nothing else to do

  if (block_entry->GetKind() != mkvparser::BlockEntry::kBlockGroup)
    return false;  // weird

  typedef mkvparser::BlockGroup BG;
  const BG* const block_group = static_cast<const BG*>(block_entry);

  const MetadataInfo& info = i->second;
  FILE* const f = info.file;

  return WriteCue(f, block_group);
}